

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> * __thiscall
pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
def<anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>(*)(anurbs::Model&,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>),pybind11::arg>
          (class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *this,char *name_,
          _func_Ref<anurbs::NurbsCurveGeometry<3L>_>_Model_ptr_shared_ptr<anurbs::NurbsCurveGeometry<3L>_>
          **f,arg *extra)

{
  _func_Ref<anurbs::NurbsCurveGeometry<3L>_>_Model_ptr_shared_ptr<anurbs::NurbsCurveGeometry<3L>_>
  *f_00;
  cpp_function cf;
  is_method local_60;
  cpp_function local_58;
  handle local_50;
  object local_48;
  char *local_40 [4];
  sibling local_20;
  
  f_00 = *f;
  local_60.class_.m_ptr = *(handle *)this;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40[0] = name_;
  getattr((pybind11 *)&local_50,local_60.class_,name_,(PyObject *)&_Py_NoneStruct);
  local_20.value.m_ptr = (handle)(handle)local_50.m_ptr;
  cpp_function::
  cpp_function<anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>,anurbs::Model&,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg>
            (&local_58,f_00,(name *)local_40,&local_60,&local_20,extra);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object(&local_48);
  cpp_function::name((cpp_function *)&local_60);
  detail::object_api<pybind11::handle>::attr
            ((obj_attr_accessor *)local_40,(object_api<pybind11::handle> *)this,local_60.class_);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_40,&local_58);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_40);
  pybind11::object::~object((object *)&local_60);
  pybind11::object::~object((object *)&local_58);
  return (class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }